

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::reset_search_structure(search_private *priv)

{
  action_repr *paVar1;
  action_repr *ar;
  action_repr *paVar2;
  float fVar3;
  float fVar4;
  
  priv->t = 0;
  priv->meta_t = 0;
  priv->loss_declared_cnt = 0;
  priv->done_with_all_actions = false;
  priv->test_loss = 0.0;
  priv->learn_loss = 0.0;
  priv->train_loss = 0.0;
  priv->num_features = 0;
  priv->should_produce_string = false;
  priv->mix_per_roll_policy = -2;
  priv->force_setup_ec_ref = false;
  if (priv->adaptive_beta == true) {
    fVar3 = log1pf(-priv->alpha);
    fVar3 = -fVar3 * (float)priv->total_examples_generated;
    fVar4 = -fVar3;
    if (fVar3 <= 0.6931472) {
      fVar3 = expm1f(fVar4);
      fVar3 = -fVar3;
    }
    else {
      fVar3 = expf(fVar4);
      fVar3 = 1.0 - fVar3;
    }
    fVar4 = 1.0;
    if (fVar3 <= 1.0) {
      fVar4 = fVar3;
    }
    priv->beta = fVar4;
  }
  paVar1 = (priv->ptag_to_action)._end;
  for (paVar2 = (priv->ptag_to_action)._begin; paVar2 != paVar1; paVar2 = paVar2 + 1) {
    if (paVar2->repr != (features *)0x0) {
      features::delete_v(paVar2->repr);
      if (paVar2->repr != (features *)0x0) {
        operator_delete(paVar2->repr);
      }
    }
  }
  v_array<Search::action_repr>::clear(&priv->ptag_to_action);
  if (priv->cb_learner == false) {
    priv->all->random_state = (ulong)((int)priv->read_example_last_id * 0x7ffdbfe5 + 0x7fb6454f);
  }
  return;
}

Assistant:

void reset_search_structure(search_private& priv)
{
  // NOTE: make sure do NOT reset priv.learn_a_idx
  priv.t = 0;
  priv.meta_t = 0;
  priv.loss_declared_cnt = 0;
  priv.done_with_all_actions = false;
  priv.test_loss = 0.;
  priv.learn_loss = 0.;
  priv.train_loss = 0.;
  priv.num_features = 0;
  priv.should_produce_string = false;
  priv.mix_per_roll_policy = -2;
  priv.force_setup_ec_ref = false;
  if (priv.adaptive_beta)
  {
    float x = -log1pf(-priv.alpha) * (float)priv.total_examples_generated;
    static const float log_of_2 = (float)0.6931471805599453;
    priv.beta = (x <= log_of_2) ? -expm1f(-x) : (1 - expf(-x));  // numerical stability
    // float priv_beta = 1.f - powf(1.f - priv.alpha, (float)priv.total_examples_generated);
    // assert( fabs(priv_beta - priv.beta) < 1e-2 );
    if (priv.beta > 1)
      priv.beta = 1;
  }
  for (Search::action_repr& ar : priv.ptag_to_action)
  {
    if (ar.repr != nullptr)
    {
      ar.repr->delete_v();
      delete ar.repr;
    }
  }
  priv.ptag_to_action.clear();

  if (!priv.cb_learner)  // was: if rollout_all_actions
  {
    priv.all->random_state = (uint32_t)(priv.read_example_last_id * 147483 + 4831921) * 2147483647;
  }
}